

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetMassLSNormFactor(void *arkode_mem,sunrealtype nrmfac)

{
  long lVar1;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  long local_28;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x675,"ARKodeSetMassLSNormFactor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_massmatrix == 0) {
    arkProcessError(in_RDI,-0x30,0x67e,"ARKodeSetMassLSNormFactor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not support non-identity mass matrices");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                  in_stack_ffffffffffffffb8);
    if (local_4 == 0) {
      if (in_XMM0_Qa <= 0.0) {
        if (0.0 <= in_XMM0_Qa) {
          lVar1 = N_VGetLength(in_RDI->tempv1);
          if (0.0 < (double)lVar1) {
            lVar1 = N_VGetLength(in_RDI->tempv1);
            dVar2 = sqrt((double)lVar1);
          }
          else {
            dVar2 = 0.0;
          }
          *(double *)(local_28 + 0x30) = dVar2;
        }
        else {
          N_VConst(0x3ff0000000000000,in_RDI->tempv1);
          dVar2 = (double)N_VDotProd(in_RDI->tempv1,in_RDI->tempv1);
          if (0.0 < dVar2) {
            dVar2 = (double)N_VDotProd(in_RDI->tempv1,in_RDI->tempv1);
            dVar2 = sqrt(dVar2);
          }
          else {
            dVar2 = 0.0;
          }
          *(double *)(local_28 + 0x30) = dVar2;
        }
      }
      else {
        *(double *)(local_28 + 0x30) = in_XMM0_Qa;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetMassLSNormFactor(void* arkode_mem, sunrealtype nrmfac)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structures */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  if (nrmfac > ZERO)
  {
    /* set user-provided factor */
    arkls_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, ark_mem->tempv1);
    arkls_mem->nrmfac = SUNRsqrt(N_VDotProd(ark_mem->tempv1, ark_mem->tempv1));
  }
  else
  {
    /* compute default factor for WRMS norm from vector legnth */
    arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(ark_mem->tempv1));
  }

  return (ARKLS_SUCCESS);
}